

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QNetworkRequest::KnownHeaders,QVariant>>
          (QtPrivate *this,QDebug debug,char *which,
          QHash<QNetworkRequest::KnownHeaders,_QVariant> *c)

{
  long lVar1;
  undefined8 uVar2;
  QDebug *pQVar3;
  QVariant *variant;
  long in_FS_OFFSET;
  QDebug local_68;
  undefined1 local_60 [8];
  QDebug local_58;
  piter local_50;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar3,"(");
  local_50 = (piter)QHash<QNetworkRequest::KnownHeaders,_QVariant>::constBegin(c);
  while ((local_50.d != (Data<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_> *)0x0 ||
         (local_50.bucket != 0))) {
    pQVar3 = QDebug::operator<<((QDebug *)debug.stream,'(');
    local_68.stream = pQVar3->stream;
    *(int *)(local_68.stream + 0x28) = *(int *)(local_68.stream + 0x28) + 1;
    ::operator<<((Stream *)local_60,(KnownHeaders)&local_68);
    variant = (QVariant *)QDebug::operator<<((QDebug *)local_60,", ");
    ::operator<<(&local_58,variant);
    QDebug::operator<<(&local_58,')');
    QDebug::~QDebug(&local_58);
    QDebug::~QDebug((QDebug *)local_60);
    QDebug::~QDebug(&local_68);
    QHashPrivate::iterator<QHashPrivate::Node<QNetworkRequest::KnownHeaders,_QVariant>_>::operator++
              (&local_50);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar2 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}